

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pages.c
# Opt level: O1

void os_pages_unmap(void *addr,size_t size)

{
  int iVar1;
  int *piVar2;
  char buf [64];
  char acStack_48 [64];
  
  iVar1 = munmap(addr,size);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    duckdb_je_buferror(*piVar2,acStack_48,0x40);
    duckdb_je_malloc_printf("<jemalloc>: Error in munmap(): %s\n",acStack_48);
    if (duckdb_je_opt_abort == true) {
      abort();
    }
  }
  return;
}

Assistant:

void
pages_unmap(void *addr, size_t size) {
	assert(PAGE_ADDR2BASE(addr) == addr);
	assert(PAGE_CEILING(size) == size);

	os_pages_unmap(addr, size);
}